

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJIO.cpp
# Opt level: O2

int main(void)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Am_Object *pAVar6;
  Am_Value *pAVar7;
  Am_Wrapper *pAVar8;
  Am_Object AVar9;
  Am_Object how_set_inter;
  Am_Object title;
  Am_Object qbutton;
  Am_Object instructions2;
  Am_Object instructions1;
  Am_Object cmd;
  Am_Object instructions3;
  Am_Object local_68;
  Am_Object local_60;
  Am_Font local_58 [8];
  Am_Font local_50 [8];
  Am_Font local_48 [8];
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Initialize();
  Am_Object::Create((char *)&title);
  uVar2 = Am_Object::Set((ushort)&title,100,0x14);
  uVar2 = Am_Object::Set(uVar2,0x65,0x14);
  uVar2 = Am_Object::Set(uVar2,0x66,0x2ee);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,0x67,500);
  Am_Object::operator=(&mywin,pAVar6);
  Am_Object::~Am_Object(&title);
  Am_Object::Am_Object(&local_18,&mywin);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_18,0),1);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Create((char *)&instructions1);
  uVar2 = Am_Object::Set((ushort)&instructions1,100,10);
  uVar2 = Am_Object::Set(uVar2,0x65,10);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(char *)0xab,0x109596);
  Am_Object::Am_Object(&title,pAVar6);
  Am_Object::~Am_Object(&instructions1);
  Am_Object::Am_Object(&local_20,&title);
  Am_Object::Add_Part((Am_Object)0x10d358,SUB81(&local_20,0),1);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Create((char *)&instructions2);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&title,0x65);
  uVar3 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set((ushort)&instructions2,0x65,(ulong)uVar3);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&title,100);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&title,0x66);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set(uVar2,100,(ulong)(iVar4 + iVar5 + 10));
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(char *)0xab,0x1095bf);
  Am_Object::Am_Object(&instructions1,pAVar6);
  Am_Object::~Am_Object(&instructions2);
  Am_Object::Am_Object(&local_28,&instructions1);
  Am_Object::Add_Part((Am_Object)0x10d358,SUB81(&local_28,0),1);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Create((char *)&instructions3);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&title,0x65);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&title,0x67);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set((ushort)&instructions3,0x65,(ulong)(iVar4 + iVar5 + 2));
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&instructions1,100);
  uVar3 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set(uVar2,100,(ulong)uVar3);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(char *)0xab,0x10960b);
  Am_Object::Am_Object(&instructions2,pAVar6);
  Am_Object::~Am_Object(&instructions3);
  Am_Object::Am_Object(&local_30,&instructions2);
  Am_Object::Add_Part((Am_Object)0x10d358,SUB81(&local_30,0),1);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Create((char *)&qbutton);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&instructions2,0x65);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&instructions2,0x67);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set((ushort)&qbutton,0x65,(ulong)(iVar4 + iVar5 + 2));
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&instructions1,100);
  uVar3 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set(uVar2,100,(ulong)uVar3);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(char *)0xab,0x109650);
  Am_Object::Am_Object(&instructions3,pAVar6);
  Am_Object::~Am_Object(&qbutton);
  Am_Object::Am_Object(&local_38,&instructions3);
  Am_Object::Add_Part((Am_Object)0x10d358,SUB81(&local_38,0),1);
  Am_Object::~Am_Object(&local_38);
  Am_Object::Create((char *)&how_set_inter);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&title,0x65);
  uVar3 = Am_Value::operator_cast_to_int(pAVar7);
  uVar2 = Am_Object::Set((ushort)&how_set_inter,0x65,(ulong)uVar3);
  pAVar8 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&JTM_Font);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0xac,(ulong)pAVar8);
  Am_Object::Am_Object(&qbutton,pAVar6);
  Am_Object::~Am_Object(&how_set_inter);
  Am_Object::Get_Object((ushort)&how_set_inter,(ulong)&qbutton);
  uVar2 = Am_Object::Set((ushort)&how_set_inter,(char *)0x150,0x10968d);
  Am_Object::Set(uVar2,(Am_Method_Wrapper *)0xca,(ulong)qmethod.from_wrapper);
  Am_Object::~Am_Object(&how_set_inter);
  pAVar7 = (Am_Value *)Am_Object::Get(0xd358,0x66);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&qbutton,0x66);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  Am_Object::Set((ushort)&qbutton,100,(ulong)((iVar4 - iVar5) - 10));
  Am_Object::Am_Object(&local_40,&qbutton);
  Am_Object::Add_Part((Am_Object)0x10d358,SUB81(&local_40,0),1);
  Am_Object::~Am_Object(&local_40);
  Test_Group_Init();
  std::operator<<((ostream *)&std::cout,"Initializing Size Face Group\n");
  std::ostream::flush();
  Size_Face_Init((char *)&how_set_inter,"\x1b$B4A;z%U%)%s%H%F%9%H\x1b(B",
                 "\x1b$B$3$l$O4A;z%F%-%9%H$NNc$G$9!#\x1b(B");
  Am_Object::operator=(&Size_Face_Group,&how_set_inter);
  Am_Object::~Am_Object(&how_set_inter);
  std::operator<<((ostream *)&std::cout,"Initializing Size Face (EUC) Group\n");
  std::ostream::flush();
  Size_Face_Init((char *)&how_set_inter,anon_var_dwarf_258a,anon_var_dwarf_25a2);
  Am_Object::operator=(&Size_Face_EUC_Group,&how_set_inter);
  Am_Object::~Am_Object(&how_set_inter);
  std::operator<<((ostream *)&std::cout,"Initializing More Sizes Group\n");
  std::ostream::flush();
  More_Sizes_Init();
  std::operator<<((ostream *)&std::cout,"Initializing Families Group\n");
  std::ostream::flush();
  Families_Init();
  std::operator<<((ostream *)&std::cout,"Initializing Edit Group\n");
  std::ostream::flush();
  Edit_Init((char *)&how_set_inter,"\x1b$B4A;zF~NO%F%9%H\x1b(B");
  Am_Object::operator=(&Edit_Group,&how_set_inter);
  Am_Object::~Am_Object(&how_set_inter);
  std::operator<<((ostream *)&std::cout,"Initializing Edit Group (EUC) \n");
  std::ostream::flush();
  Edit_Init((char *)&how_set_inter,anon_var_dwarf_2626);
  Am_Object::operator=(&Edit_EUC_Group,&how_set_inter);
  Am_Object::~Am_Object(&how_set_inter);
  std::operator<<((ostream *)&std::cout,"Initializing Ktable Group\n");
  std::ostream::flush();
  Am_Font::Am_Font(local_48,(Am_Font *)&JTL_Font);
  Ktable_Init((Am_Font *)&how_set_inter,(char *)local_48,"\x1b$B4A;z%3!<%II=\x1b(B",
              "Japanese Kanji Code Table");
  Am_Object::operator=(&Ktable_Group,&how_set_inter);
  Am_Object::~Am_Object(&how_set_inter);
  Am_Font::~Am_Font(local_48);
  std::operator<<((ostream *)&std::cout,"Initializing Kktable Group\n");
  std::ostream::flush();
  Am_Font::Am_Font(local_50,(Am_Font *)&KTL_Font);
  Ktable_Init((Am_Font *)&how_set_inter,(char *)local_50,"\x1b$B4A;z%3!<%II=\x1b(B",
              "Korean Code Table");
  Am_Object::operator=(&Kktable_Group,&how_set_inter);
  Am_Object::~Am_Object(&how_set_inter);
  Am_Font::~Am_Font(local_50);
  std::operator<<((ostream *)&std::cout,"Initializing Kctable Group\n");
  std::ostream::flush();
  Am_Font::Am_Font(local_58,(Am_Font *)&CTL_Font);
  Ktable_Init((Am_Font *)&how_set_inter,(char *)local_58,"\x1b$B4A;z%3!<%II=\x1b(B",
              "Chinese Code Table");
  Am_Object::operator=(&Kctable_Group,&how_set_inter);
  Am_Object::~Am_Object(&how_set_inter);
  Am_Font::~Am_Font(local_58);
  Am_Object::Create((char *)&cmd);
  uVar2 = Am_Object::Set((ushort)&cmd,(char *)0xb9,0x1098cf);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,true,1);
  Am_Object::Am_Object(&how_set_inter,pAVar6);
  Am_Object::~Am_Object(&cmd);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&how_set_inter,0xc5);
  Am_Object::Am_Object(&cmd,pAVar7);
  Am_Object::Set((ushort)&cmd,(Am_Method_Wrapper *)0xca,(ulong)change_setting.from_wrapper);
  Am_Object::Am_Object(&local_60,&how_set_inter);
  Am_Object::Add_Part((Am_Object)0x10d358,SUB81(&local_60,0),1);
  Am_Object::~Am_Object(&local_60);
  AVar1 = DISPLAY_PART;
  Am_Object::Am_Object(&local_68,&Test_Group);
  AVar9.data._2_6_ = 0;
  AVar9.data._0_2_ = AVar1;
  Am_Object::Add_Part(0xd358,AVar9,(ulong)&local_68);
  Am_Object::~Am_Object(&local_68);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(&cmd);
  Am_Object::~Am_Object(&how_set_inter);
  Am_Object::~Am_Object(&qbutton);
  Am_Object::~Am_Object(&instructions3);
  Am_Object::~Am_Object(&instructions2);
  Am_Object::~Am_Object(&instructions1);
  Am_Object::~Am_Object(&title);
  return 0;
}

Assistant:

int
main()
{
  Am_Initialize();

  mywin = Am_Window.Create("mywin")
              .Set(Am_LEFT, 20)
              .Set(Am_TOP, 20)
              .Set(Am_WIDTH, 750)
              .Set(Am_HEIGHT, 500);
  Am_Screen.Add_Part(mywin);

  Am_Object title = Am_Text.Create("title")
                        .Set(Am_LEFT, 10)
                        .Set(Am_TOP, 10)
                        .Set(Am_TEXT, "Japanese I/O Test  Type:  ");
  mywin.Add_Part(title);

  Am_Object instructions1 =
      Am_Text.Create("instructions1")
          .Set(Am_TOP, (int)title.Get(Am_TOP))
          .Set(Am_LEFT, (int)title.Get(Am_LEFT) + (int)title.Get(Am_WIDTH) + 10)
          .Set(Am_TEXT,
               "1 for Size Face, 2 for More Sizes, 3 for Families, 4 for Edit");
  mywin.Add_Part(instructions1);

  Am_Object instructions2 =
      Am_Text.Create("instructions2")
          .Set(Am_TOP, (int)title.Get(Am_TOP) + (int)title.Get(Am_HEIGHT) + 2)
          .Set(Am_LEFT, (int)instructions1.Get(Am_LEFT))
          .Set(Am_TEXT, "5 for Size Face (EUC), 6 for Edit (EUC), 7 for "
                        "Ktable, 8 for Kktable");
  mywin.Add_Part(instructions2);

  Am_Object instructions3 =
      Am_Text.Create("instructions2")
          .Set(Am_TOP, (int)instructions2.Get(Am_TOP) +
                           (int)instructions2.Get(Am_HEIGHT) + 2)
          .Set(Am_LEFT, (int)instructions1.Get(Am_LEFT))
          .Set(Am_TEXT, "9 for Kctable, 0 for Nothing, q (or button) for Quit");
  mywin.Add_Part(instructions3);

  Am_Object qbutton = Am_Button.Create("qbutton")
                          .Set(Am_TOP, (int)title.Get(Am_TOP))
                          .Set(Am_FONT, QBUTTON_FONT);
  qbutton.Get_Object(Am_COMMAND)
      .Set(Am_LABEL, QBUTTON_STRING)
      .Set(Am_DO_METHOD, qmethod);
  qbutton.Set(Am_LEFT,
              (int)mywin.Get(Am_WIDTH) - (int)qbutton.Get(Am_WIDTH) - 10);
  mywin.Add_Part(qbutton);

  Test_Group_Init();
  cout << "Initializing Size Face Group\n" << flush;
  Size_Face_Group = Size_Face_Init(KANJI, TEST_STRING, "Size Face");
  cout << "Initializing Size Face (EUC) Group\n" << flush;
  Size_Face_EUC_Group =
      Size_Face_Init(EUC_KANJI, EUC_TEST_STRING, "Size Face EUC");
  cout << "Initializing More Sizes Group\n" << flush;
  More_Sizes_Init();
  cout << "Initializing Families Group\n" << flush;
  Families_Init();
  cout << "Initializing Edit Group\n" << flush;
  Edit_Group = Edit_Init(KANJIE, PTEXT_STRING);
  cout << "Initializing Edit Group (EUC) \n" << flush;
  Edit_EUC_Group = Edit_Init(EUC_KANJIE, EUC_PTEXT_STRING);
  cout << "Initializing Ktable Group\n" << flush;
  Ktable_Group =
      Ktable_Init(KLINE_FONT, KTITLE, "Japanese Kanji Code Table", "Ktable");
  cout << "Initializing Kktable Group\n" << flush;
  Kktable_Group =
      Ktable_Init(KKLINE_FONT, KKTITLE, "Korean Code Table", "Kktable");
  cout << "Initializing Kctable Group\n" << flush;
  Kctable_Group =
      Ktable_Init(KCLINE_FONT, KCTITLE, "Chinese Code Table", "Kctable");

  Am_Object how_set_inter = Am_One_Shot_Interactor.Create("change_settings")
                                .Set(Am_START_WHEN, "ANY_KEYBOARD")
                                .Set(Am_START_WHERE_TEST, true);

  Am_Object cmd = how_set_inter.Get(Am_COMMAND);
  cmd.Set(Am_DO_METHOD, change_setting);
  mywin.Add_Part(how_set_inter);

  mywin.Add_Part(DISPLAY_PART, Test_Group);

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}